

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::detail::formatTruncated<node::BlockfileType>
               (ostream *out,BlockfileType *value,int ntrunc)

{
  char *pcVar1;
  char *in_RDI;
  long in_FS_OFFSET;
  string result;
  ostringstream tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  BlockfileType *in_stack_fffffffffffffe10;
  ostream *in_stack_fffffffffffffe18;
  ostringstream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_180);
  ::node::operator<<(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::__cxx11::ostringstream::str();
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (in_stack_fffffffffffffe08);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_fffffffffffffe08);
  std::min<int>((int *)in_stack_fffffffffffffe10,(int *)in_stack_fffffffffffffe08);
  std::ostream::write(in_RDI,(long)pcVar1);
  std::__cxx11::string::~string(in_stack_fffffffffffffe08);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void formatTruncated(std::ostream& out, const T& value, int ntrunc)
{
    std::ostringstream tmp;
    tmp << value;
    std::string result = tmp.str();
    out.write(result.c_str(), (std::min)(ntrunc, static_cast<int>(result.size())));
}